

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void Fl::remove_system_handler(Fl_System_Handler ha)

{
  system_handler_link *psVar1;
  system_handler_link **ppsVar2;
  system_handler_link *psVar3;
  
  if (sys_handlers == (system_handler_link *)0x0) {
    return;
  }
  psVar3 = sys_handlers;
  if (sys_handlers->handle == ha) {
    psVar1 = (system_handler_link *)0x0;
  }
  else {
    do {
      psVar1 = psVar3;
      psVar3 = psVar1->next;
      if (psVar3 == (system_handler_link *)0x0) {
        return;
      }
    } while (psVar3->handle != ha);
  }
  ppsVar2 = &sys_handlers;
  if (psVar1 != (system_handler_link *)0x0) {
    ppsVar2 = &psVar1->next;
  }
  *ppsVar2 = psVar3->next;
  operator_delete(psVar3,0x18);
  return;
}

Assistant:

void Fl::remove_system_handler(Fl_System_Handler ha) {
  system_handler_link *l, *p;

  // Search for the handler in the list...
  for (l = sys_handlers, p = 0; l && l->handle != ha; p = l, l = l->next);

  if (l) {
    // Found it, so remove it from the list...
    if (p) p->next = l->next;
    else sys_handlers = l->next;

    // And free the record...
    delete l;
  }
}